

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void set_operand_size(m680x_info *info,cs_m680x_op *op,uint8_t default_size)

{
  cs_m680x *m680x;
  uint8_t default_size_local;
  cs_m680x_op *op_local;
  m680x_info *info_local;
  
  if ((info->insn == M680X_INS_JMP) || (info->insn == M680X_INS_JSR)) {
    op->size = '\0';
  }
  else if ((info->insn == M680X_INS_DIVD) ||
          (((info->insn == M680X_INS_AIS || (info->insn == M680X_INS_AIX)) &&
           (op->type != M680X_OP_REGISTER)))) {
    op->size = '\x01';
  }
  else if ((info->insn == M680X_INS_DIVQ) || (info->insn == M680X_INS_MOVW)) {
    op->size = '\x02';
  }
  else if (info->insn == M680X_INS_EMACS) {
    op->size = '\x04';
  }
  else if (((info->m680x).op_count == '\0') || ((info->m680x).operands[0].type != M680X_OP_REGISTER)
          ) {
    op->size = default_size;
  }
  else {
    op->size = (info->m680x).operands[0].size;
  }
  return;
}

Assistant:

static void set_operand_size(m680x_info *info, cs_m680x_op *op,
	uint8_t default_size)
{
	cs_m680x *m680x = &info->m680x;

	if (info->insn == M680X_INS_JMP || info->insn == M680X_INS_JSR)
		op->size = 0;
	else if (info->insn == M680X_INS_DIVD ||
		((info->insn == M680X_INS_AIS || info->insn == M680X_INS_AIX) &&
			op->type != M680X_OP_REGISTER))
		op->size = 1;
	else if (info->insn == M680X_INS_DIVQ ||
		info->insn == M680X_INS_MOVW)
		op->size = 2;
	else if (info->insn == M680X_INS_EMACS)
		op->size = 4;
	else if ((m680x->op_count > 0) &&
		(m680x->operands[0].type == M680X_OP_REGISTER))
		op->size = m680x->operands[0].size;
	else
		op->size = default_size;
}